

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O2

aiScene * __thiscall Assimp::Importer::ReadFile(Importer *this,char *_pFile,uint pFlags)

{
  pointer ppBVar1;
  IOSystem *pIVar2;
  ProgressHandler *pPVar3;
  unique_ptr<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_> uVar4;
  bool bVar5;
  int iVar6;
  Logger *pLVar7;
  ImporterPimpl *pIVar8;
  __uniq_ptr_data<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>,_true,_true>
  this_00;
  long lVar9;
  long *plVar10;
  ulong uVar11;
  undefined4 extraout_var_00;
  aiScene *paVar12;
  aiMetadata *paVar13;
  BaseImporter *pBVar14;
  uint uVar15;
  size_t __n;
  allocator<char> local_499;
  unique_ptr<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
  profiler;
  string ext;
  string pFile;
  ScenePreprocessor pre;
  ValidateDSProcess ds;
  undefined4 extraout_var;
  
  if (this->pimpl == (ImporterPimpl *)0x0) {
    __assert_fail("nullptr != pimpl",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/Importer.cpp"
                  ,0x233,"const aiScene *Assimp::Importer::ReadFile(const char *, unsigned int)");
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&pFile,_pFile,(allocator<char> *)&ds)
  ;
  WriteLogOpening(&pFile);
  pIVar8 = this->pimpl;
  if (pIVar8->mScene != (aiScene *)0x0) {
    pLVar7 = DefaultLogger::get();
    Logger::debug(pLVar7,"(Deleting previous scene)");
    FreeScene(this);
    pIVar8 = this->pimpl;
  }
  iVar6 = (*pIVar8->mIOHandler->_vptr_IOSystem[2])(pIVar8->mIOHandler,pFile._M_dataplus._M_p);
  if ((char)iVar6 == '\0') {
    std::operator+(&ext,"Unable to open file \"",&pFile);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ds,&ext,
                   "\".");
    std::__cxx11::string::operator=((string *)&this->pimpl->mErrorString,(string *)&ds);
    std::__cxx11::string::~string((string *)&ds);
    std::__cxx11::string::~string((string *)&ext);
    pLVar7 = DefaultLogger::get();
    Logger::error(pLVar7,&this->pimpl->mErrorString);
    goto LAB_0030e39c;
  }
  iVar6 = GetPropertyInteger(this,"GLOB_MEASURE_TIME",0);
  if (iVar6 == 0) {
    profiler._M_t.
    super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
    ._M_t.
    super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
    .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl =
         (__uniq_ptr_data<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>,_true,_true>
          )(__uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
            )0x0;
  }
  else {
    this_00.
    super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
    ._M_t.
    super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
    .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl =
         (__uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
          )operator_new(0x30);
    (((_Rb_tree_header *)
     ((long)this_00.
            super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
            ._M_t.
            super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
            .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl + 8))->
    _M_header)._M_color = _S_red;
    *(_Base_ptr *)
     ((long)this_00.
            super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
            ._M_t.
            super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
            .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl + 0x10) =
         (_Base_ptr)0x0;
    *(_Base_ptr *)
     ((long)this_00.
            super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
            ._M_t.
            super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
            .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl + 0x18) =
         (_Base_ptr)
         ((long)this_00.
                super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
                ._M_t.
                super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
                .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl + 8);
    *(_Base_ptr *)
     ((long)this_00.
            super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
            ._M_t.
            super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
            .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl + 0x20) =
         (_Base_ptr)
         ((long)this_00.
                super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
                ._M_t.
                super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
                .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl + 8);
    *(size_t *)
     ((long)this_00.
            super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
            ._M_t.
            super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
            .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl + 0x28) = 0;
    profiler._M_t.
    super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
    ._M_t.
    super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
    .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl =
         (__uniq_ptr_data<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>,_true,_true>
          )(__uniq_ptr_data<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>,_true,_true>
            )this_00.
             super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
             ._M_t.
             super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
             .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ds,"total",(allocator<char> *)&ext);
    Profiling::Profiler::BeginRegion
              ((Profiler *)
               this_00.
               super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
               ._M_t.
               super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
               .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl,
               (string *)&ds);
    std::__cxx11::string::~string((string *)&ds);
  }
  SetPropertyInteger(this,"importerIndex",-1);
  uVar15 = 0;
  while( true ) {
    uVar11 = (ulong)uVar15;
    pIVar8 = this->pimpl;
    ppBVar1 = (pIVar8->mImporter).
              super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(pIVar8->mImporter).
                      super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar1 >> 3) <= uVar11)
    break;
    pBVar14 = ppBVar1[uVar11];
    iVar6 = (*pBVar14->_vptr_BaseImporter[3])(pBVar14,&pFile,pIVar8->mIOHandler,0);
    if ((char)iVar6 != '\0') {
      pBVar14 = (this->pimpl->mImporter).
                super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar11];
      SetPropertyInteger(this,"importerIndex",uVar15);
      if (pBVar14 != (BaseImporter *)0x0) goto LAB_0030e2c6;
      break;
    }
    uVar15 = uVar15 + 1;
  }
  lVar9 = std::__cxx11::string::rfind((char)&pFile,0x2e);
  if (lVar9 != -1) {
    pLVar7 = DefaultLogger::get();
    Logger::info(pLVar7,"File extension not known, trying signature-based detection");
    uVar15 = 0;
    while( true ) {
      uVar11 = (ulong)uVar15;
      pIVar8 = this->pimpl;
      ppBVar1 = (pIVar8->mImporter).
                super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(pIVar8->mImporter).
                        super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar1 >> 3) <= uVar11)
      break;
      pBVar14 = ppBVar1[uVar11];
      iVar6 = (*pBVar14->_vptr_BaseImporter[3])(pBVar14,&pFile,pIVar8->mIOHandler,1);
      if ((char)iVar6 != '\0') {
        pBVar14 = (this->pimpl->mImporter).
                  super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar11];
        SetPropertyInteger(this,"importerIndex",uVar15);
        if (pBVar14 != (BaseImporter *)0x0) goto LAB_0030e2c6;
        break;
      }
      uVar15 = uVar15 + 1;
    }
  }
  std::operator+(&ext,"No suitable reader found for the file format of file \"",&pFile);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ds,&ext,"\"."
                );
  std::__cxx11::string::operator=((string *)&this->pimpl->mErrorString,(string *)&ds);
  std::__cxx11::string::~string((string *)&ds);
  std::__cxx11::string::~string((string *)&ext);
  pLVar7 = DefaultLogger::get();
  Logger::error(pLVar7,&this->pimpl->mErrorString);
LAB_0030e392:
  std::unique_ptr<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>::
  ~unique_ptr(&profiler);
LAB_0030e39c:
  std::__cxx11::string::~string((string *)&pFile);
  return (aiScene *)0x0;
LAB_0030e2c6:
  pIVar2 = this->pimpl->mIOHandler;
  std::__cxx11::string::string<std::allocator<char>>((string *)&ds,"rb",(allocator<char> *)&ext);
  iVar6 = (*pIVar2->_vptr_IOSystem[4])
                    (pIVar2,pFile._M_dataplus._M_p,
                     CONCAT44(ds.super_BaseProcess._vptr_BaseProcess._4_4_,
                              ds.super_BaseProcess._vptr_BaseProcess._0_4_));
  plVar10 = (long *)CONCAT44(extraout_var,iVar6);
  std::__cxx11::string::~string((string *)&ds);
  if (plVar10 == (long *)0x0) {
    uVar11 = 0;
  }
  else {
    uVar11 = (**(code **)(*plVar10 + 0x30))(plVar10);
    pIVar2 = this->pimpl->mIOHandler;
    (*pIVar2->_vptr_IOSystem[5])(pIVar2,plVar10);
  }
  iVar6 = (*pBVar14->_vptr_BaseImporter[5])(pBVar14);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ext,"unknown",(allocator<char> *)&ds);
  if (CONCAT44(extraout_var_00,iVar6) != 0) {
    std::__cxx11::string::assign((char *)&ext);
  }
  pLVar7 = DefaultLogger::get();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pre,
                 "Found a matching importer for this file format: ",&ext);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ds,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pre,".");
  Logger::info(pLVar7,(char *)CONCAT44(ds.super_BaseProcess._vptr_BaseProcess._4_4_,
                                       ds.super_BaseProcess._vptr_BaseProcess._0_4_));
  std::__cxx11::string::~string((string *)&ds);
  std::__cxx11::string::~string((string *)&pre);
  pPVar3 = this->pimpl->mProgressHandler;
  (*pPVar3->_vptr_ProgressHandler[3])(pPVar3,0,uVar11 & 0xffffffff);
  uVar4 = profiler;
  if ((__uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
       )profiler._M_t.
        super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
        ._M_t.
        super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
        .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
       )0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ds,"import",(allocator<char> *)&pre);
    Profiling::Profiler::BeginRegion
              ((Profiler *)
               uVar4._M_t.
               super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
               ._M_t.
               super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
               .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl,
               (string *)&ds);
    std::__cxx11::string::~string((string *)&ds);
  }
  paVar12 = BaseImporter::ReadFile(pBVar14,this,&pFile,this->pimpl->mIOHandler);
  this->pimpl->mScene = paVar12;
  pPVar3 = this->pimpl->mProgressHandler;
  (*pPVar3->_vptr_ProgressHandler[3])(pPVar3,uVar11 & 0xffffffff,uVar11 & 0xffffffff);
  uVar4 = profiler;
  if ((__uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
       )profiler._M_t.
        super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
        ._M_t.
        super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
        .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
       )0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ds,"import",(allocator<char> *)&pre);
    Profiling::Profiler::EndRegion
              ((Profiler *)
               uVar4._M_t.
               super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
               ._M_t.
               super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
               .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl,
               (string *)&ds);
    std::__cxx11::string::~string((string *)&ds);
  }
  SetPropertyString(this,"sourceFilePath",&pFile);
  pIVar8 = this->pimpl;
  if (pIVar8->mScene == (aiScene *)0x0) {
    std::__cxx11::string::_M_assign((string *)&pIVar8->mErrorString);
    goto LAB_0030e6ab;
  }
  paVar13 = pIVar8->mScene->mMetaData;
  if (paVar13 == (aiMetadata *)0x0) {
LAB_0030e546:
    paVar13 = (aiMetadata *)operator_new(0x18);
    paVar13->mNumProperties = 0;
    paVar13->mKeys = (aiString *)0x0;
    paVar13->mValues = (aiMetadataEntry *)0x0;
    pIVar8->mScene->mMetaData = paVar13;
    paVar13 = this->pimpl->mScene->mMetaData;
LAB_0030e56b:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&pre,"SourceAsset_Format",&local_499);
    __n = 0x3ff;
    if ((ext._M_string_length & 0xfffffc00) == 0) {
      __n = ext._M_string_length & 0xffffffff;
    }
    ds.super_BaseProcess._vptr_BaseProcess._0_4_ = (undefined4)__n;
    memcpy((void *)((long)&ds.super_BaseProcess._vptr_BaseProcess + 4),ext._M_dataplus._M_p,__n);
    *(undefined1 *)((long)&ds.super_BaseProcess._vptr_BaseProcess + __n + 4) = 0;
    aiMetadata::Add<aiString>(paVar13,(string *)&pre,(aiString *)&ds);
    std::__cxx11::string::~string((string *)&pre);
  }
  else {
    bVar5 = aiMetadata::HasKey(paVar13,"SourceAsset_Format");
    if (!bVar5) {
      pIVar8 = this->pimpl;
      paVar13 = pIVar8->mScene->mMetaData;
      if (paVar13 == (aiMetadata *)0x0) goto LAB_0030e546;
      goto LAB_0030e56b;
    }
  }
  if ((pFlags >> 10 & 1) != 0) {
    ValidateDSProcess::ValidateDSProcess(&ds);
    BaseProcess::ExecuteOnScene(&ds.super_BaseProcess,this);
    paVar12 = this->pimpl->mScene;
    ValidateDSProcess::~ValidateDSProcess(&ds);
    if (paVar12 == (aiScene *)0x0) {
      std::__cxx11::string::~string((string *)&ext);
      goto LAB_0030e392;
    }
  }
  uVar4._M_t.
  super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
  ._M_t.
  super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
  .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl =
       profiler._M_t.
       super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
       ._M_t.
       super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
       .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl;
  if ((__uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
       )profiler._M_t.
        super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
        ._M_t.
        super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
        .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
       )0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ds,"preprocess",(allocator<char> *)&pre);
    Profiling::Profiler::BeginRegion
              ((Profiler *)
               uVar4._M_t.
               super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
               ._M_t.
               super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
               .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl,
               (string *)&ds);
    std::__cxx11::string::~string((string *)&ds);
  }
  pre.scene = this->pimpl->mScene;
  ScenePreprocessor::ProcessScene(&pre);
  uVar4 = profiler;
  if ((__uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
       )profiler._M_t.
        super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
        ._M_t.
        super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
        .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
       )0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&ds,"preprocess",&local_499);
    Profiling::Profiler::EndRegion
              ((Profiler *)
               uVar4._M_t.
               super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
               ._M_t.
               super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
               .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl,
               (string *)&ds);
    std::__cxx11::string::~string((string *)&ds);
  }
  ApplyPostProcessing(this,pFlags & 0xfffffbff);
LAB_0030e6ab:
  SharedPostProcessInfo::Clean(this->pimpl->mPPShared);
  uVar4 = profiler;
  if ((__uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
       )profiler._M_t.
        super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
        ._M_t.
        super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
        .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
       )0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ds,"total",(allocator<char> *)&pre);
    Profiling::Profiler::EndRegion
              ((Profiler *)
               uVar4._M_t.
               super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
               ._M_t.
               super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
               .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl,
               (string *)&ds);
    std::__cxx11::string::~string((string *)&ds);
  }
  std::__cxx11::string::~string((string *)&ext);
  std::unique_ptr<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>::
  ~unique_ptr(&profiler);
  std::__cxx11::string::~string((string *)&pFile);
  return this->pimpl->mScene;
}

Assistant:

const aiScene* Importer::ReadFile( const char* _pFile, unsigned int pFlags) {
    ai_assert(nullptr != pimpl);
    
    ASSIMP_BEGIN_EXCEPTION_REGION();
    const std::string pFile(_pFile);

    // ----------------------------------------------------------------------
    // Put a large try block around everything to catch all std::exception's
    // that might be thrown by STL containers or by new().
    // ImportErrorException's are throw by ourselves and caught elsewhere.
    //-----------------------------------------------------------------------

    WriteLogOpening(pFile);

#ifdef ASSIMP_CATCH_GLOBAL_EXCEPTIONS
    try
#endif // ! ASSIMP_CATCH_GLOBAL_EXCEPTIONS
    {
        // Check whether this Importer instance has already loaded
        // a scene. In this case we need to delete the old one
        if (pimpl->mScene)  {

            ASSIMP_LOG_DEBUG("(Deleting previous scene)");
            FreeScene();
        }

        // First check if the file is accessible at all
        if( !pimpl->mIOHandler->Exists( pFile)) {

            pimpl->mErrorString = "Unable to open file \"" + pFile + "\".";
            ASSIMP_LOG_ERROR(pimpl->mErrorString);
            return nullptr;
        }

        std::unique_ptr<Profiler> profiler(GetPropertyInteger(AI_CONFIG_GLOB_MEASURE_TIME,0)?new Profiler():NULL);
        if (profiler) {
            profiler->BeginRegion("total");
        }

        // Find an worker class which can handle the file
        BaseImporter* imp = nullptr;
        SetPropertyInteger("importerIndex", -1);
        for( unsigned int a = 0; a < pimpl->mImporter.size(); a++)  {

            if( pimpl->mImporter[a]->CanRead( pFile, pimpl->mIOHandler, false)) {
                imp = pimpl->mImporter[a];
                SetPropertyInteger("importerIndex", a);
                break;
            }
        }

        if (!imp)   {
            // not so bad yet ... try format auto detection.
            const std::string::size_type s = pFile.find_last_of('.');
            if (s != std::string::npos) {
                ASSIMP_LOG_INFO("File extension not known, trying signature-based detection");
                for( unsigned int a = 0; a < pimpl->mImporter.size(); a++)  {
                    if( pimpl->mImporter[a]->CanRead( pFile, pimpl->mIOHandler, true)) {
                        imp = pimpl->mImporter[a];
                        SetPropertyInteger("importerIndex", a);
                        break;
                    }
                }
            }
            // Put a proper error message if no suitable importer was found
            if( !imp)   {
                pimpl->mErrorString = "No suitable reader found for the file format of file \"" + pFile + "\".";
                ASSIMP_LOG_ERROR(pimpl->mErrorString);
                return nullptr;
            }
        }

        // Get file size for progress handler
        IOStream * fileIO = pimpl->mIOHandler->Open( pFile );
        uint32_t fileSize = 0;
        if (fileIO)
        {
            fileSize = static_cast<uint32_t>(fileIO->FileSize());
            pimpl->mIOHandler->Close( fileIO );
        }

        // Dispatch the reading to the worker class for this format
        const aiImporterDesc *desc( imp->GetInfo() );
        std::string ext( "unknown" );
        if ( nullptr != desc ) {
            ext = desc->mName;
        }
        ASSIMP_LOG_INFO("Found a matching importer for this file format: " + ext + "." );
        pimpl->mProgressHandler->UpdateFileRead( 0, fileSize );

        if (profiler) {
            profiler->BeginRegion("import");
        }

        pimpl->mScene = imp->ReadFile( this, pFile, pimpl->mIOHandler);
        pimpl->mProgressHandler->UpdateFileRead( fileSize, fileSize );

        if (profiler) {
            profiler->EndRegion("import");
        }

        SetPropertyString("sourceFilePath", pFile);

        // If successful, apply all active post processing steps to the imported data
        if( pimpl->mScene)  {
            if (!pimpl->mScene->mMetaData || !pimpl->mScene->mMetaData->HasKey(AI_METADATA_SOURCE_FORMAT)) {
                if (!pimpl->mScene->mMetaData) {
                    pimpl->mScene->mMetaData = new aiMetadata;
                }
                pimpl->mScene->mMetaData->Add(AI_METADATA_SOURCE_FORMAT, aiString(ext));
            }

#ifndef ASSIMP_BUILD_NO_VALIDATEDS_PROCESS
            // The ValidateDS process is an exception. It is executed first, even before ScenePreprocessor is called.
            if (pFlags & aiProcess_ValidateDataStructure) {
                ValidateDSProcess ds;
                ds.ExecuteOnScene (this);
                if (!pimpl->mScene) {
                    return nullptr;
                }
            }
#endif // no validation

            // Preprocess the scene and prepare it for post-processing
            if (profiler) {
                profiler->BeginRegion("preprocess");
            }

            ScenePreprocessor pre(pimpl->mScene);
            pre.ProcessScene();

            if (profiler) {
                profiler->EndRegion("preprocess");
            }

            // Ensure that the validation process won't be called twice
            ApplyPostProcessing(pFlags & (~aiProcess_ValidateDataStructure));
        }
        // if failed, extract the error string
        else if( !pimpl->mScene) {
            pimpl->mErrorString = imp->GetErrorText();
        }

        // clear any data allocated by post-process steps
        pimpl->mPPShared->Clean();

        if (profiler) {
            profiler->EndRegion("total");
        }
    }
#ifdef ASSIMP_CATCH_GLOBAL_EXCEPTIONS
    catch (std::exception &e) {
#if (defined _MSC_VER) &&   (defined _CPPRTTI)
        // if we have RTTI get the full name of the exception that occurred
        pimpl->mErrorString = std::string(typeid( e ).name()) + ": " + e.what();
#else
        pimpl->mErrorString = std::string("std::exception: ") + e.what();
#endif

        ASSIMP_LOG_ERROR(pimpl->mErrorString);
        delete pimpl->mScene; pimpl->mScene = nullptr;
    }
#endif // ! ASSIMP_CATCH_GLOBAL_EXCEPTIONS

    // either successful or failure - the pointer expresses it anyways
    ASSIMP_END_EXCEPTION_REGION_WITH_ERROR_STRING(const aiScene*, pimpl->mErrorString);
    
    return pimpl->mScene;
}